

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall
Assimp::STEP::InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment>_>
::operator()(InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment>_>
             *this,Lazy<Assimp::IFC::Schema_2x3::IfcUnitAssignment> *out,
            shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *in_base,DB *db)

{
  element_type *peVar1;
  long lVar2;
  LazyObject *pLVar3;
  TypeError *this_00;
  string local_40;
  
  peVar1 = (in_base->
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(peVar1,&EXPRESS::DataType::typeinfo,&EXPRESS::ENTITY::typeinfo,0);
  }
  if (lVar2 != 0) {
    pLVar3 = DB::GetObject(db,*(uint64_t *)(lVar2 + 8));
    out->obj = pLVar3;
    return;
  }
  this_00 = (TypeError *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"type error reading entity","");
  TypeError::TypeError(this_00,&local_40,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this_00,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()(Lazy<T>& out, const std::shared_ptr< const EXPRESS::DataType >& in_base, const STEP::DB& db) {
            const EXPRESS::ENTITY* in = dynamic_cast<const EXPRESS::ENTITY*>(in_base.get());
            if (!in) {
                throw TypeError("type error reading entity");
            }
            out = Couple<T>(db).GetObject(*in);
        }